

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O2

void Aig_ObjCreateRepr(Aig_Man_t *p,Aig_Obj_t *pNode1,Aig_Obj_t *pNode2)

{
  int iVar1;
  uint __line;
  char *__assertion;
  
  if (p->pReprs == (Aig_Obj_t **)0x0) {
    __assertion = "p->pReprs != NULL";
    __line = 0x55;
  }
  else if (((ulong)pNode1 & 1) == 0) {
    if (((ulong)pNode2 & 1) == 0) {
      if (pNode1->Id < p->nReprsAlloc) {
        iVar1 = pNode2->Id;
        if (iVar1 < p->nReprsAlloc) {
          if (pNode1->Id < iVar1) {
            p->pReprs[iVar1] = pNode1;
            return;
          }
          __assertion = "pNode1->Id < pNode2->Id";
          __line = 0x5a;
        }
        else {
          __assertion = "pNode2->Id < p->nReprsAlloc";
          __line = 0x59;
        }
      }
      else {
        __assertion = "pNode1->Id < p->nReprsAlloc";
        __line = 0x58;
      }
    }
    else {
      __assertion = "!Aig_IsComplement(pNode2)";
      __line = 0x57;
    }
  }
  else {
    __assertion = "!Aig_IsComplement(pNode1)";
    __line = 0x56;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRepr.c"
                ,__line,"void Aig_ObjCreateRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
}

Assistant:

void Aig_ObjCreateRepr( Aig_Man_t * p, Aig_Obj_t * pNode1, Aig_Obj_t * pNode2 )
{
    assert( p->pReprs != NULL );
    assert( !Aig_IsComplement(pNode1) );
    assert( !Aig_IsComplement(pNode2) );
    assert( pNode1->Id < p->nReprsAlloc );
    assert( pNode2->Id < p->nReprsAlloc );
    assert( pNode1->Id < pNode2->Id );
    p->pReprs[pNode2->Id] = pNode1;
}